

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O3

void msdfgen::generateMSDF
               (Bitmap<msdfgen::FloatRGB> *output,Shape *shape,double range,Vector2 *scale,
               Vector2 *translate,double edgeThreshold)

{
  SignedDistance b;
  SignedDistance a;
  SignedDistance b_00;
  SignedDistance a_00;
  SignedDistance b_01;
  SignedDistance a_01;
  SignedDistance b_02;
  SignedDistance b_03;
  SignedDistance b_04;
  bool bVar1;
  int iVar2;
  uint uVar3;
  EdgeSegment *pEVar4;
  FloatRGB *pFVar5;
  uint uVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  EdgeHolder *this;
  int iVar12;
  pointer pCVar13;
  int x;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector2 VVar20;
  SignedDistance a_02;
  SignedDistance a_03;
  SignedDistance a_04;
  EdgePoint sr;
  vector<int,_std::allocator<int>_> windings;
  double param;
  EdgePoint sg;
  EdgePoint sb;
  vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> contourSD;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1c8;
  SignedDistance local_198;
  EdgeHolder *local_188;
  undefined8 uStack_180;
  SignedDistance local_178;
  EdgeHolder *local_168;
  undefined8 uStack_160;
  SignedDistance local_158;
  EdgeHolder *local_148;
  undefined8 uStack_140;
  SignedDistance local_138;
  EdgeHolder *local_128;
  undefined8 uStack_120;
  vector<int,_std::allocator<int>_> local_118;
  Shape *local_f8;
  undefined8 local_f0;
  double local_e8;
  undefined8 uStack_e0;
  SignedDistance local_d8;
  EdgeHolder *local_c8;
  undefined8 uStack_c0;
  double local_b8;
  ulong local_b0;
  Bitmap<msdfgen::FloatRGB> *local_a8;
  Vector2 *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  SignedDistance local_78;
  EdgeHolder *local_68;
  undefined8 uStack_60;
  vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_> local_58;
  Vector2 *local_40;
  double local_38;
  
  uVar9 = (int)((long)(shape->contours).
                      super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(shape->contours).
                      super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_b8 = edgeThreshold;
  local_a0 = scale;
  local_40 = translate;
  iVar2 = Bitmap<msdfgen::FloatRGB>::width(output);
  uVar3 = Bitmap<msdfgen::FloatRGB>::height(output);
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&local_118,(long)(int)uVar9);
  pCVar13 = (shape->contours).
            super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_f8 = shape;
  if (pCVar13 !=
      (shape->contours).super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_138.distance._0_4_ = Contour::winding(pCVar13);
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_138);
      }
      else {
        *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_138.distance._0_4_;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pCVar13 = pCVar13 + 1;
    } while (pCVar13 !=
             (local_f8->contours).
             super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_58.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>::resize
            (&local_58,(long)(int)uVar9);
  if (0 < (int)uVar3) {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    uVar11 = 0;
    local_a8 = output;
    do {
      uVar6 = (uint)uVar11;
      uVar8 = ~uVar6 + uVar3;
      if (local_f8->inverseYAxis == false) {
        uVar8 = uVar6;
      }
      local_b0 = uVar11;
      if (0 < iVar2) {
        local_38 = (double)(int)uVar6 + 0.5;
        x = 0;
        do {
          Vector2::Vector2((Vector2 *)&local_d8,(double)x + 0.5,local_38);
          VVar20 = Vector2::operator/((Vector2 *)&local_d8,local_a0);
          local_138.dot = VVar20.y;
          local_138.distance._0_4_ = VVar20.x._0_4_;
          local_138.distance._4_4_ = VVar20.x._4_4_;
          VVar20 = Vector2::operator-((Vector2 *)&local_138,local_40);
          dVar17 = VVar20.y;
          SignedDistance::SignedDistance(&local_138);
          SignedDistance::SignedDistance(&local_d8);
          SignedDistance::SignedDistance(&local_78);
          local_68 = (EdgeHolder *)0x0;
          uStack_60 = 0;
          local_c8 = (EdgeHolder *)0x0;
          uStack_c0 = 0;
          local_128 = (EdgeHolder *)0x0;
          uStack_120 = 0;
          local_98 = 1e+240;
          uStack_90 = 0x8000000000000000;
          local_e8 = -1e+240;
          uStack_e0 = 0;
          uVar14 = VVar20.x._0_4_;
          if ((int)uVar9 < 1) {
            iVar12 = 0;
          }
          else {
            pCVar13 = (local_f8->contours).
                      super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_88 = 1e+240;
            uStack_80 = 0;
            uVar11 = 0;
            iVar12 = 0;
            do {
              SignedDistance::SignedDistance(&local_158);
              SignedDistance::SignedDistance(&local_178);
              SignedDistance::SignedDistance(&local_198);
              local_188 = (EdgeHolder *)0x0;
              uStack_180 = 0;
              local_168 = (EdgeHolder *)0x0;
              uStack_160 = 0;
              local_148 = (EdgeHolder *)0x0;
              uStack_140 = 0;
              for (this = *(EdgeHolder **)
                           &(pCVar13->edges).
                            super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                  ; this != (pCVar13->edges).
                            super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                            ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
                pEVar4 = EdgeHolder::operator->(this);
                dVar18 = dVar17;
                (*pEVar4->_vptr_EdgeSegment[5])(uVar14,pEVar4,&local_f0);
                dVar19 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                pEVar4 = EdgeHolder::operator->(this);
                if (((pEVar4->color & RED) != BLACK) &&
                   (b_01.dot = local_158.dot, b_01.distance = local_158.distance, a_02.dot = dVar18,
                   a_02.distance = dVar19, bVar1 = operator<(a_02,b_01), bVar1)) {
                  uStack_140 = local_f0;
                  local_158.distance = dVar19;
                  local_158.dot = dVar18;
                  local_148 = this;
                }
                pEVar4 = EdgeHolder::operator->(this);
                if (((pEVar4->color & GREEN) != BLACK) &&
                   (b_00.dot = local_178.dot, b_00.distance = local_178.distance, a_03.dot = dVar18,
                   a_03.distance = dVar19, bVar1 = operator<(a_03,b_00), bVar1)) {
                  uStack_160 = local_f0;
                  local_178.distance = dVar19;
                  local_178.dot = dVar18;
                  local_168 = this;
                }
                pEVar4 = EdgeHolder::operator->(this);
                if (((pEVar4->color & BLUE) != BLACK) &&
                   (b.dot = local_198.dot, b.distance = local_198.distance, a_04.dot = dVar18,
                   a_04.distance = dVar19, bVar1 = operator<(a_04,b), bVar1)) {
                  uStack_180 = local_f0;
                  local_198.distance = dVar19;
                  local_198.dot = dVar18;
                  local_188 = this;
                }
              }
              a_01.dot = local_158.dot;
              a_01.distance = local_158.distance;
              b_02.distance._4_4_ = local_138.distance._4_4_;
              b_02.distance._0_4_ = local_138.distance._0_4_;
              b_02.dot = local_138.dot;
              bVar1 = operator<(a_01,b_02);
              if (bVar1) {
                local_128 = local_148;
                uStack_120 = uStack_140;
                local_138.distance._0_4_ = SUB84(local_158.distance,0);
                local_138.distance._4_4_ = (undefined4)((ulong)local_158.distance >> 0x20);
                local_138.dot = local_158.dot;
              }
              a_00.dot = local_178.dot;
              a_00.distance = local_178.distance;
              b_03.dot = local_d8.dot;
              b_03.distance = local_d8.distance;
              bVar1 = operator<(a_00,b_03);
              if (bVar1) {
                local_c8 = local_168;
                uStack_c0 = uStack_160;
                local_d8.distance = local_178.distance;
                local_d8.dot = local_178.dot;
              }
              a.dot = local_198.dot;
              a.distance = local_198.distance;
              b_04.dot = local_78.dot;
              b_04.distance = local_78.distance;
              bVar1 = operator<(a,b_04);
              if (bVar1) {
                local_68 = local_188;
                uStack_60 = uStack_180;
                local_78.distance = local_198.distance;
                local_78.dot = local_198.dot;
              }
              uVar15 = SUB84(local_198.distance,0);
              uVar16 = (undefined4)((ulong)local_198.distance >> 0x20);
              dVar19 = local_178.distance;
              if (local_158.distance <= local_178.distance) {
                dVar19 = local_158.distance;
              }
              dVar18 = local_178.distance;
              if (local_178.distance <= local_158.distance) {
                dVar18 = local_158.distance;
              }
              if (dVar18 <= local_198.distance) {
                uVar15 = SUB84(dVar18,0);
                uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
              }
              if ((double)CONCAT44(uVar16,uVar15) <= dVar19) {
                uVar15 = SUB84(dVar19,0);
                uVar16 = (undefined4)((ulong)dVar19 >> 0x20);
              }
              if (ABS((double)CONCAT44(uVar16,uVar15)) < local_88) {
                iVar12 = -local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11];
                uStack_80 = 0;
                local_88 = ABS((double)CONCAT44(uVar16,uVar15));
              }
              if (local_148 != (EdgeHolder *)0x0) {
                pEVar4 = EdgeHolder::operator->(local_148);
                (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_140,pEVar4,&local_158);
              }
              if (local_168 != (EdgeHolder *)0x0) {
                pEVar4 = EdgeHolder::operator->(local_168);
                (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_160,pEVar4,&local_178);
              }
              if (local_188 != (EdgeHolder *)0x0) {
                pEVar4 = EdgeHolder::operator->(local_188);
                (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_180,pEVar4,&local_198);
              }
              local_58.
              super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11].r = local_158.distance;
              local_58.
              super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11].g = local_178.distance;
              dVar19 = local_178.distance;
              if (local_158.distance <= local_178.distance) {
                dVar19 = local_158.distance;
              }
              dVar18 = local_178.distance;
              if (local_178.distance <= local_158.distance) {
                dVar18 = local_158.distance;
              }
              local_58.
              super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11].b = local_198.distance;
              uVar15 = SUB84(local_198.distance,0);
              uVar16 = (undefined4)((ulong)local_198.distance >> 0x20);
              if (dVar18 <= local_198.distance) {
                uVar15 = SUB84(dVar18,0);
                uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
              }
              if ((double)CONCAT44(uVar16,uVar15) <= dVar19) {
                uVar15 = SUB84(dVar19,0);
                uVar16 = (undefined4)((ulong)dVar19 >> 0x20);
              }
              local_58.
              super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11].med = (double)CONCAT44(uVar16,uVar15)
              ;
              if ((double)CONCAT44(uVar16,uVar15) < 0.0 ||
                  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] < 1) {
                if (((double)CONCAT44(uVar16,uVar15) <= 0.0 &&
                     local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11] < 0) &&
                   (ABS((double)CONCAT44(uVar16,uVar15)) < ABS(local_98))) {
                  local_98 = (double)CONCAT44(uVar16,uVar15);
                  uStack_90 = 0;
                }
              }
              else if (ABS((double)CONCAT44(uVar16,uVar15)) < ABS(local_e8)) {
                local_e8 = (double)CONCAT44(uVar16,uVar15);
                uStack_e0 = 0;
              }
              uVar11 = uVar11 + 1;
              pCVar13 = pCVar13 + 1;
            } while (uVar11 != uVar10);
            output = local_a8;
            if (local_128 != (EdgeHolder *)0x0) {
              pEVar4 = EdgeHolder::operator->(local_128);
              output = local_a8;
              (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_120,pEVar4,&local_138);
            }
          }
          if (local_c8 != (EdgeHolder *)0x0) {
            pEVar4 = EdgeHolder::operator->(local_c8);
            (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_c0,pEVar4,&local_d8);
          }
          if (local_68 != (EdgeHolder *)0x0) {
            pEVar4 = EdgeHolder::operator->(local_68);
            (*pEVar4->_vptr_EdgeSegment[6])(uVar14,dVar17,uStack_60,pEVar4,&local_78);
          }
          local_1c8 = -1e+240;
          if ((local_e8 < 0.0) || (ABS(local_98) < ABS(local_e8))) {
            if ((0.0 < local_98) || (ABS(local_e8) < ABS(local_98))) {
              local_1d8 = -1e+240;
              local_1e8 = -1e+240;
              local_1e0 = -1e+240;
            }
            else {
              local_1d8 = 1e+240;
              if ((int)uVar9 < 1) goto LAB_0016646c;
              pdVar7 = &(local_58.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->med;
              uVar11 = 0;
              local_1e0 = -1e+240;
              local_1e8 = -1e+240;
              do {
                if (((local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11] < 0) &&
                    (dVar17 = *pdVar7, dVar17 < local_1d8)) && (ABS(dVar17) < ABS(local_e8))) {
                  local_1c8 = ((MultiDistance *)(pdVar7 + -3))->r;
                  local_1e0 = pdVar7[-2];
                  local_1e8 = pdVar7[-1];
                  local_1d8 = dVar17;
                }
                uVar11 = uVar11 + 1;
                pdVar7 = pdVar7 + 4;
              } while (uVar10 != uVar11);
              iVar12 = -1;
            }
LAB_001663e2:
            if (0 < (int)uVar9) {
              pdVar7 = &(local_58.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->med;
              uVar11 = 0;
              do {
                if ((local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11] != iVar12) &&
                   (ABS(*pdVar7) < ABS(local_1d8))) {
                  local_1c8 = ((MultiDistance *)(pdVar7 + -3))->r;
                  local_1e0 = pdVar7[-2];
                  local_1e8 = pdVar7[-1];
                  local_1d8 = *pdVar7;
                }
                uVar11 = uVar11 + 1;
                pdVar7 = pdVar7 + 4;
              } while (uVar10 != uVar11);
            }
          }
          else {
            if (0 < (int)uVar9) {
              pdVar7 = &(local_58.
                         super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                         ._M_impl.super__Vector_impl_data._M_start)->med;
              uVar11 = 0;
              local_1e0 = -1e+240;
              local_1e8 = -1e+240;
              local_1d8 = -1e+240;
              do {
                if (((0 < local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]) &&
                    (dVar17 = *pdVar7, local_1d8 < dVar17)) && (ABS(dVar17) < ABS(local_98))) {
                  local_1c8 = ((MultiDistance *)(pdVar7 + -3))->r;
                  local_1e0 = pdVar7[-2];
                  local_1e8 = pdVar7[-1];
                  local_1d8 = dVar17;
                }
                uVar11 = uVar11 + 1;
                pdVar7 = pdVar7 + 4;
              } while (uVar10 != uVar11);
              iVar12 = 1;
              goto LAB_001663e2;
            }
            local_1d8 = -1e+240;
LAB_0016646c:
            local_1e8 = -1e+240;
            local_1e0 = -1e+240;
          }
          local_88 = (double)CONCAT44(local_138.distance._4_4_,local_138.distance._0_4_);
          dVar17 = local_d8.distance;
          if (local_88 <= local_d8.distance) {
            dVar17 = local_88;
          }
          uStack_80 = 0;
          dVar19 = local_d8.distance;
          if (local_d8.distance <= local_88) {
            dVar19 = local_88;
          }
          local_e8 = local_78.distance;
          if (dVar19 <= local_78.distance) {
            local_e8 = dVar19;
          }
          if (local_e8 <= dVar17) {
            local_e8 = dVar17;
          }
          uStack_e0 = 0;
          if ((local_e8 == local_1d8) && (!NAN(local_e8) && !NAN(local_1d8))) {
            local_1e8 = local_78.distance;
          }
          if ((local_e8 == local_1d8) && (!NAN(local_e8) && !NAN(local_1d8))) {
            local_1e0 = local_d8.distance;
          }
          pFVar5 = Bitmap<msdfgen::FloatRGB>::operator()(output,x,uVar8);
          pFVar5->r = (float)((double)(~-(ulong)(local_e8 == local_1d8) & (ulong)local_1c8 |
                                      (ulong)local_88 & -(ulong)(local_e8 == local_1d8)) / range +
                             0.5);
          pFVar5 = Bitmap<msdfgen::FloatRGB>::operator()(output,x,uVar8);
          pFVar5->g = (float)(local_1e0 / range + 0.5);
          pFVar5 = Bitmap<msdfgen::FloatRGB>::operator()(output,x,uVar8);
          pFVar5->b = (float)(local_1e8 / range + 0.5);
          x = x + 1;
        } while (x != iVar2);
      }
      uVar8 = (int)local_b0 + 1;
      uVar11 = (ulong)uVar8;
    } while (uVar8 != uVar3);
  }
  if (local_58.super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<msdfgen::MultiDistance,_std::allocator<msdfgen::MultiDistance>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0.0 < local_b8) {
    VVar20 = Vector2::operator*(local_a0,range);
    local_d8.dot = VVar20.y;
    local_d8.distance = VVar20.x;
    VVar20 = operator/(local_b8,(Vector2 *)&local_d8);
    local_138.dot = VVar20.y;
    local_138.distance._0_4_ = VVar20.x._0_4_;
    local_138.distance._4_4_ = VVar20.x._4_4_;
    msdfErrorCorrection(output,(Vector2 *)&local_138);
  }
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generateMSDF(Bitmap<FloatRGB> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate, double edgeThreshold) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<MultiDistance> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;

                struct EdgePoint {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge;
                    double nearParam;
                } sr, sg, sb;
                sr.nearEdge = sg.nearEdge = sb.nearEdge = NULL;
                sr.nearParam = sg.nearParam = sb.nearParam = 0;
                double d = fabs(SignedDistance::INFINITE.distance);
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    EdgePoint r, g, b;
                    r.nearEdge = g.nearEdge = b.nearEdge = NULL;
                    r.nearParam = g.nearParam = b.nearParam = 0;

                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if ((*edge)->color&RED && distance < r.minDistance) {
                            r.minDistance = distance;
                            r.nearEdge = &*edge;
                            r.nearParam = param;
                        }
                        if ((*edge)->color&GREEN && distance < g.minDistance) {
                            g.minDistance = distance;
                            g.nearEdge = &*edge;
                            g.nearParam = param;
                        }
                        if ((*edge)->color&BLUE && distance < b.minDistance) {
                            b.minDistance = distance;
                            b.nearEdge = &*edge;
                            b.nearParam = param;
                        }
                    }
                    if (r.minDistance < sr.minDistance)
                        sr = r;
                    if (g.minDistance < sg.minDistance)
                        sg = g;
                    if (b.minDistance < sb.minDistance)
                        sb = b;

                    double medMinDistance = fabs(median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance));
                    if (medMinDistance < d) {
                        d = medMinDistance;
                        winding = -windings[i];
                    }
                    if (r.nearEdge)
                        (*r.nearEdge)->distanceToPseudoDistance(r.minDistance, p, r.nearParam);
                    if (g.nearEdge)
                        (*g.nearEdge)->distanceToPseudoDistance(g.minDistance, p, g.nearParam);
                    if (b.nearEdge)
                        (*b.nearEdge)->distanceToPseudoDistance(b.minDistance, p, b.nearParam);
                    medMinDistance = median(r.minDistance.distance, g.minDistance.distance, b.minDistance.distance);
                    contourSD[i].r = r.minDistance.distance;
                    contourSD[i].g = g.minDistance.distance;
                    contourSD[i].b = b.minDistance.distance;
                    contourSD[i].med = medMinDistance;
                    if (windings[i] > 0 && medMinDistance >= 0 && fabs(medMinDistance) < fabs(posDist))
                        posDist = medMinDistance;
                    if (windings[i] < 0 && medMinDistance <= 0 && fabs(medMinDistance) < fabs(negDist))
                        negDist = medMinDistance;
                }
                if (sr.nearEdge)
                    (*sr.nearEdge)->distanceToPseudoDistance(sr.minDistance, p, sr.nearParam);
                if (sg.nearEdge)
                    (*sg.nearEdge)->distanceToPseudoDistance(sg.minDistance, p, sg.nearParam);
                if (sb.nearEdge)
                    (*sb.nearEdge)->distanceToPseudoDistance(sb.minDistance, p, sb.nearParam);

                MultiDistance msd;
                msd.r = msd.g = msd.b = msd.med = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    msd.med = SignedDistance::INFINITE.distance;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i].med > msd.med && fabs(contourSD[i].med) < fabs(negDist))
                            msd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    msd.med = -SignedDistance::INFINITE.distance;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i].med < msd.med && fabs(contourSD[i].med) < fabs(posDist))
                            msd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i].med) < fabs(msd.med))
                        msd = contourSD[i];
                if (median(sr.minDistance.distance, sg.minDistance.distance, sb.minDistance.distance) == msd.med) {
                    msd.r = sr.minDistance.distance;
                    msd.g = sg.minDistance.distance;
                    msd.b = sb.minDistance.distance;
                }

                output(x, row).r = float(msd.r/range+.5);
                output(x, row).g = float(msd.g/range+.5);
                output(x, row).b = float(msd.b/range+.5);
            }
        }
    }

    if (edgeThreshold > 0)
        msdfErrorCorrection(output, edgeThreshold/(scale*range));
}